

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O0

bool __thiscall
ritobin::io::impl_binary_write::BinBinaryWriter::process(BinBinaryWriter *this,Bin *bin)

{
  bool bVar1;
  Bin *bin_local;
  BinBinaryWriter *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->error);
  std::vector<char,_std::allocator<char>_>::clear((this->writer).buffer_);
  bVar1 = write_sections(this,bin);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = fail_msg(this,"write_sections(bin)\n");
  }
  return this_local._7_1_;
}

Assistant:

bool process(Bin const& bin) noexcept {
            error.clear();
            writer.buffer_.clear();
            bin_assert(write_sections(bin));
            return true;
        }